

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uchar *puVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int itemsize;
  int iVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *extraout_RDX_04;
  uchar *puVar15;
  uchar *extraout_RDX_05;
  uchar **ppuVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  uchar **ppuStack_20088;
  uchar **hash_table [16384];
  uchar *local_50;
  uchar *local_40;
  uint local_38;
  int local_34;
  
  local_40 = (uchar *)0x0;
  uVar5 = 5;
  if (5 < quality) {
    uVar5 = (ulong)(uint)quality;
  }
  stbiw__sbgrowf(&local_40,1,(int)out_len);
  iVar8 = *(int *)(local_40 + -4);
  *(int *)(local_40 + -4) = iVar8 + 1;
  local_40[iVar8] = 'x';
  iVar13 = *(int *)(local_40 + -4);
  iVar8 = iVar13 + 1;
  if (*(int *)(local_40 + -8) <= iVar8) {
    stbiw__sbgrowf(&local_40,1,itemsize);
    iVar13 = *(int *)(local_40 + -4);
    iVar8 = iVar13 + 1;
  }
  *(int *)(local_40 + -4) = iVar8;
  local_40[iVar13] = '^';
  local_38 = 1;
  local_34 = 1;
  puVar6 = stbiw__zlib_flushf(local_40,&local_38,&local_34);
  local_38 = local_38 | 1 << ((byte)local_34 & 0x1f);
  local_34 = local_34 + 2;
  local_50 = stbiw__zlib_flushf(puVar6,&local_38,&local_34);
  uVar22 = 0;
  local_40 = local_50;
  memset(&ppuStack_20088,0,0x20000);
  if (3 < data_len) {
    iVar8 = (int)uVar5;
    uVar22 = 0;
    uVar14 = extraout_RDX;
    do {
      iVar13 = (int)uVar14;
      pbVar1 = data + (int)uVar22;
      uVar9 = (uint)CONCAT12(data[(long)(int)uVar22 + 2],*(undefined2 *)(data + (int)uVar22)) * 8 ^
              (uint)CONCAT12(data[(long)(int)uVar22 + 2],*(undefined2 *)(data + (int)uVar22));
      uVar9 = (uVar9 >> 5) + uVar9;
      uVar9 = uVar9 * 0x10 ^ uVar9;
      uVar9 = (uVar9 >> 0x11) + uVar9;
      uVar20 = (ulong)((uVar9 >> 6) + uVar9 & 0x3fff);
      ppuVar16 = hash_table[uVar20 - 1];
      if (ppuVar16 == (uchar **)0x0) {
        iVar11 = 3;
        puVar6 = (uchar *)0x0;
LAB_001068a7:
        stbiw__sbgrowf(hash_table + (uVar20 - 1),8,iVar13);
        ppuVar16 = hash_table[uVar20 - 1];
        iVar21 = *(int *)((long)ppuVar16 + -4);
        iVar10 = iVar21 + 1;
      }
      else {
        if ((long)*(int *)((long)ppuVar16 + -4) < 1) {
          iVar11 = 3;
          puVar6 = (uchar *)0x0;
        }
        else {
          iVar13 = data_len - uVar22;
          uVar9 = iVar13 - 1;
          if (0x100 < uVar9) {
            uVar9 = 0x101;
          }
          iVar11 = 3;
          lVar18 = 0;
          puVar6 = (uchar *)0x0;
          do {
            puVar15 = ppuVar16[lVar18];
            if ((long)(int)(uVar22 - 0x8000) < (long)puVar15 - (long)data) {
              uVar19 = 0;
              if (0 < iVar13) {
                do {
                  if (puVar15[uVar19] != pbVar1[uVar19]) goto LAB_0010684e;
                  uVar19 = uVar19 + 1;
                } while (uVar9 + 1 != uVar19);
                uVar19 = (ulong)(uVar9 + 1);
              }
LAB_0010684e:
              iVar10 = (int)uVar19;
              iVar21 = iVar11;
              if (iVar11 < iVar10) {
                iVar21 = iVar10;
              }
              bVar3 = iVar11 <= iVar10;
              iVar11 = iVar21;
              if (bVar3) {
                puVar6 = puVar15;
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != *(int *)((long)ppuVar16 + -4));
          if (ppuVar16 == (uchar **)0x0) goto LAB_001068a7;
        }
        iVar21 = *(int *)((long)ppuVar16 + -4);
        if (*(int *)((long)ppuVar16 + -4) == iVar8 * 2) {
          memmove(ppuVar16,ppuVar16 + uVar5,uVar5 * 8);
          *(int *)((long)ppuVar16 + -4) = iVar8;
          iVar21 = iVar8;
          iVar13 = extraout_EDX;
        }
        iVar10 = iVar21 + 1;
        if (*(int *)(ppuVar16 + -1) <= iVar10) goto LAB_001068a7;
      }
      *(int *)((long)ppuVar16 + -4) = iVar10;
      ppuVar16[iVar21] = pbVar1;
      bVar7 = (byte)local_34;
      if (puVar6 == (uchar *)0x0) {
LAB_00106a02:
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar9 = bVar2 + 0x30;
          iVar13 = 0;
          iVar11 = -8;
          do {
            iVar13 = (uVar9 & 1) + iVar13 * 2;
            uVar9 = uVar9 >> 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar9 = iVar13 << (bVar7 & 0x1f);
          local_34 = local_34 + 8;
        }
        else {
          uVar9 = bVar2 | 0x100;
          iVar13 = 0;
          iVar11 = -9;
          do {
            iVar13 = (uVar9 & 1) + iVar13 * 2;
            uVar9 = uVar9 >> 1;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar9 = iVar13 << (bVar7 & 0x1f);
          local_34 = local_34 + 9;
        }
        local_38 = local_38 | uVar9;
        iVar11 = 1;
LAB_00106b76:
        local_50 = stbiw__zlib_flushf(local_50,&local_38,&local_34);
        uVar14 = extraout_RDX_01;
      }
      else {
        uVar9 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar9 = (uVar9 >> 5) + uVar9;
        uVar9 = uVar9 * 0x10 ^ uVar9;
        uVar9 = (uVar9 >> 0x11) + uVar9;
        ppuVar16 = hash_table[(ulong)((uVar9 >> 6) + uVar9 & 0x3fff) - 1];
        if ((ppuVar16 != (uchar **)0x0) && (0 < (long)*(int *)((long)ppuVar16 + -4))) {
          uVar9 = (~uVar22 + data_len) - 1;
          if (0x100 < uVar9) {
            uVar9 = 0x101;
          }
          lVar18 = 0;
          do {
            if ((long)(int)(uVar22 - 0x7fff) < (long)ppuVar16[lVar18] - (long)data) {
              uVar20 = 0;
              if (0 < (int)(~uVar22 + data_len)) {
                do {
                  if (ppuVar16[lVar18][uVar20] != pbVar1[uVar20 + 1]) goto LAB_0010698e;
                  uVar20 = uVar20 + 1;
                } while (uVar9 + 1 != uVar20);
                uVar20 = (ulong)(uVar9 + 1);
              }
LAB_0010698e:
              if (iVar11 < (int)uVar20) goto LAB_00106a02;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != *(int *)((long)ppuVar16 + -4));
        }
        iVar13 = (int)pbVar1 - (int)puVar6;
        if ((0x7fff < iVar13) || (0x102 < iVar11)) {
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                        ,0x20f,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar20 = 0;
        do {
          uVar19 = uVar20;
          uVar20 = uVar19 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar19 + 1] <= iVar11);
        if (uVar19 < 0x17) {
          iVar21 = 0;
          iVar10 = -7;
          do {
            iVar21 = ((uint)uVar20 & 1) + iVar21 * 2;
            uVar20 = (ulong)((uint)uVar20 >> 1);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar9 = iVar21 << (bVar7 & 0x1f);
          local_34 = local_34 + 7;
        }
        else {
          uVar9 = (int)uVar20 + 0xa8;
          iVar21 = 0;
          iVar10 = -8;
          do {
            iVar21 = (uVar9 & 1) + iVar21 * 2;
            uVar9 = uVar9 >> 1;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
          uVar9 = iVar21 << (bVar7 & 0x1f);
          local_34 = local_34 + 8;
        }
        local_38 = local_38 | uVar9;
        puVar6 = stbiw__zlib_flushf(local_50,&local_38,&local_34);
        uVar19 = uVar19 & 0xffffffff;
        if (0xffffffffffffffeb < uVar19 - 0x1c) {
          local_38 = local_38 |
                     iVar11 - (uint)stbi_zlib_compress::lengthc[uVar19] << ((byte)local_34 & 0x1f);
          local_34 = (uint)""[uVar19] + local_34;
          puVar6 = stbiw__zlib_flushf(puVar6,&local_38,&local_34);
        }
        uVar20 = 0xffffffffffffffff;
        do {
          lVar18 = uVar20 + 2;
          uVar20 = uVar20 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar18] <= iVar13);
        iVar21 = 0;
        iVar10 = -5;
        uVar19 = uVar20 & 0xffffffff;
        do {
          iVar21 = ((uint)uVar19 & 1) + iVar21 * 2;
          uVar19 = uVar19 >> 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 0);
        local_38 = local_38 | iVar21 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 5;
        local_50 = stbiw__zlib_flushf(puVar6,&local_38,&local_34);
        uVar14 = extraout_RDX_00;
        if (3 < uVar20) {
          local_38 = local_38 |
                     iVar13 - (uint)stbi_zlib_compress::distc[uVar20 & 0xffffffff] <<
                     ((byte)local_34 & 0x1f);
          local_34 = (uint)""[uVar20 & 0xffffffff] + local_34;
          goto LAB_00106b76;
        }
      }
      uVar22 = iVar11 + uVar22;
    } while ((int)uVar22 < data_len + -3);
  }
  local_40 = local_50;
  if ((int)uVar22 < data_len) {
    lVar18 = (long)(int)uVar22;
    do {
      bVar7 = data[lVar18];
      if (bVar7 < 0x90) {
        uVar22 = bVar7 + 0x30;
        iVar8 = 0;
        iVar13 = -8;
        do {
          iVar8 = (uVar22 & 1) + iVar8 * 2;
          uVar22 = uVar22 >> 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 0);
        uVar22 = iVar8 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 8;
      }
      else {
        uVar22 = bVar7 | 0x100;
        iVar8 = 0;
        iVar13 = -9;
        do {
          iVar8 = (uVar22 & 1) + iVar8 * 2;
          uVar22 = uVar22 >> 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 0);
        uVar22 = iVar8 << ((byte)local_34 & 0x1f);
        local_34 = local_34 + 9;
      }
      local_38 = local_38 | uVar22;
      local_50 = stbiw__zlib_flushf(local_50,&local_38,&local_34);
      lVar18 = lVar18 + 1;
    } while ((int)lVar18 != data_len);
  }
  local_34 = local_34 + 7;
  local_40 = local_50;
  puVar6 = stbiw__zlib_flushf(local_50,&local_38,&local_34);
  puVar15 = extraout_RDX_02;
  if (local_34 != 0) {
    do {
      local_34 = local_34 + 1;
      puVar6 = stbiw__zlib_flushf(puVar6,&local_38,&local_34);
      puVar15 = extraout_RDX_03;
    } while (local_34 != 0);
  }
  lVar18 = 0;
  local_40 = puVar6;
  do {
    if (hash_table[lVar18 + -1] != (uchar **)0x0) {
      free(hash_table[lVar18 + -1] + -1);
      puVar15 = extraout_RDX_04;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x4000);
  if (data_len < 1) {
    uVar22 = 0;
    uVar9 = 1;
  }
  else {
    uVar4 = (uint)data_len % 0x15b0;
    uVar9 = 1;
    uVar12 = 0;
    puVar15 = (uchar *)0x80078071;
    uVar22 = 0;
    do {
      if (uVar4 != 0) {
        uVar5 = (ulong)uVar4;
        uVar17 = uVar12;
        do {
          uVar9 = uVar9 + data[uVar17];
          uVar22 = uVar22 + uVar9;
          uVar17 = uVar17 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        uVar9 = uVar9 % 0xfff1;
        uVar22 = uVar22 % 0xfff1;
      }
      uVar12 = uVar12 + uVar4;
      uVar4 = 0x15b0;
    } while ((int)uVar12 < data_len);
  }
  if (puVar6 != (uchar *)0x0) {
    iVar13 = *(int *)(puVar6 + -4);
    iVar8 = iVar13 + 1;
    puVar15 = puVar6;
    if (iVar8 < *(int *)(puVar6 + -8)) goto LAB_00106d5e;
  }
  stbiw__sbgrowf(&local_40,1,(int)puVar15);
  iVar13 = *(int *)(local_40 + -4);
  iVar8 = iVar13 + 1;
  puVar6 = local_40;
LAB_00106d5e:
  *(int *)(puVar6 + -4) = iVar8;
  puVar6[iVar13] = (uchar)(uVar22 >> 8);
  if (*(int *)(puVar6 + -8) <= *(int *)(puVar6 + -4) + 1) {
    stbiw__sbgrowf(&local_40,1,(int)puVar6);
    puVar6 = extraout_RDX_05;
  }
  iVar11 = (int)puVar6;
  iVar8 = *(int *)(local_40 + -4);
  *(int *)(local_40 + -4) = iVar8 + 1;
  local_40[iVar8] = (uchar)uVar22;
  iVar13 = *(int *)(local_40 + -4);
  iVar8 = iVar13 + 1;
  if (*(int *)(local_40 + -8) <= iVar8) {
    stbiw__sbgrowf(&local_40,1,iVar11);
    iVar13 = *(int *)(local_40 + -4);
    iVar8 = iVar13 + 1;
    iVar11 = extraout_EDX_00;
  }
  *(int *)(local_40 + -4) = iVar8;
  local_40[iVar13] = (uchar)(uVar9 >> 8);
  iVar13 = *(int *)(local_40 + -4);
  iVar8 = iVar13 + 1;
  if (*(int *)(local_40 + -8) <= iVar8) {
    stbiw__sbgrowf(&local_40,1,iVar11);
    iVar13 = *(int *)(local_40 + -4);
    iVar8 = iVar13 + 1;
  }
  *(int *)(local_40 + -4) = iVar8;
  local_40[iVar13] = (uchar)uVar9;
  iVar8 = *(int *)(local_40 + -4);
  *out_len = iVar8;
  puVar6 = (uchar *)memmove(local_40 + -8,local_40,(long)iVar8);
  return puVar6;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char **hash_table[stbiw__ZHASH]; // 64KB on the stack!
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);

   {
      // compute adler32 on input
      unsigned int i=0, s1=1, s2=0, blocklen = data_len % 5552;
      int j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, (unsigned char) (s2 >> 8));
      stbiw__sbpush(out, (unsigned char) s2);
      stbiw__sbpush(out, (unsigned char) (s1 >> 8));
      stbiw__sbpush(out, (unsigned char) s1);
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
}